

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O3

void __thiscall
HighsSimplexAnalysis::dualSteepestEdgeWeightError
          (HighsSimplexAnalysis *this,double computed_edge_weight,double updated_edge_weight)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  string error_type;
  undefined1 *local_30;
  char *local_28;
  undefined1 local_20 [16];
  
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"  OK","");
  this->num_dual_steepest_edge_weight_check = this->num_dual_steepest_edge_weight_check + 1;
  if (updated_edge_weight < computed_edge_weight * 0.25) {
    this->num_dual_steepest_edge_weight_reject = this->num_dual_steepest_edge_weight_reject + 1;
  }
  if (computed_edge_weight <= updated_edge_weight) {
    dVar6 = 0.0;
    if (4.0 < updated_edge_weight / computed_edge_weight) {
      std::__cxx11::string::_M_replace((ulong)&local_30,0,local_28,0x3d6d43);
      dVar6 = 0.01;
    }
    dVar3 = this->average_log_high_dual_steepest_edge_weight_error;
    dVar10 = log(updated_edge_weight / computed_edge_weight);
    dVar3 = dVar3 * 0.99 + dVar10 * 0.01;
    this->average_log_high_dual_steepest_edge_weight_error = dVar3;
    dVar10 = this->average_log_low_dual_steepest_edge_weight_error;
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    if (4.0 < computed_edge_weight / updated_edge_weight) {
      std::__cxx11::string::_M_replace((ulong)&local_30,0,local_28,0x3d6d3e);
      dVar4 = 0.01;
    }
    dVar6 = this->average_log_low_dual_steepest_edge_weight_error;
    dVar3 = log(computed_edge_weight / updated_edge_weight);
    dVar10 = dVar6 * 0.99 + dVar3 * 0.01;
    this->average_log_low_dual_steepest_edge_weight_error = dVar10;
    dVar3 = this->average_log_high_dual_steepest_edge_weight_error;
    dVar6 = 0.0;
  }
  auVar8._0_8_ = this->max_average_frequency_low_dual_steepest_edge_weight;
  auVar8._8_8_ = this->max_average_frequency_high_dual_steepest_edge_weight;
  auVar1._0_8_ = this->max_sum_average_frequency_extreme_dual_steepest_edge_weight;
  auVar1._8_8_ = this->max_average_log_low_dual_steepest_edge_weight_error;
  auVar2._0_8_ = this->max_average_log_high_dual_steepest_edge_weight_error;
  auVar2._8_8_ = this->max_sum_average_log_extreme_dual_steepest_edge_weight_error;
  auVar7._0_8_ = this->average_frequency_low_dual_steepest_edge_weight * 0.99 + dVar4;
  auVar7._8_8_ = this->average_frequency_high_dual_steepest_edge_weight * 0.99 + dVar6;
  this->average_frequency_low_dual_steepest_edge_weight = auVar7._0_8_;
  this->average_frequency_high_dual_steepest_edge_weight = auVar7._8_8_;
  auVar5._0_8_ = auVar7._8_8_ + auVar7._0_8_;
  auVar8 = maxpd(auVar7,auVar8);
  this->max_average_frequency_low_dual_steepest_edge_weight = (double)auVar8._0_8_;
  this->max_average_frequency_high_dual_steepest_edge_weight = (double)auVar8._8_8_;
  auVar5._8_8_ = dVar10;
  auVar8 = maxpd(auVar5,auVar1);
  this->max_sum_average_frequency_extreme_dual_steepest_edge_weight = (double)auVar8._0_8_;
  this->max_average_log_low_dual_steepest_edge_weight_error = (double)auVar8._8_8_;
  auVar9._8_8_ = dVar10 + dVar3;
  auVar9._0_8_ = dVar3;
  auVar8 = maxpd(auVar9,auVar2);
  this->max_average_log_high_dual_steepest_edge_weight_error = (double)auVar8._0_8_;
  this->max_sum_average_log_extreme_dual_steepest_edge_weight_error = (double)auVar8._8_8_;
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::dualSteepestEdgeWeightError(
    const double computed_edge_weight, const double updated_edge_weight) {
  const double kWeightErrorThreshold = 4.0;
  const bool accept_weight =
      updated_edge_weight >= kAcceptDseWeightThreshold * computed_edge_weight;
  HighsInt low_weight_error = 0;
  HighsInt high_weight_error = 0;
  double weight_error;
  string error_type = "  OK";
  num_dual_steepest_edge_weight_check++;
  if (!accept_weight) num_dual_steepest_edge_weight_reject++;
  if (updated_edge_weight < computed_edge_weight) {
    // Updated weight is low
    weight_error = computed_edge_weight / updated_edge_weight;
    if (weight_error > kWeightErrorThreshold) {
      low_weight_error = 1;
      error_type = " Low";
    }
    average_log_low_dual_steepest_edge_weight_error =
        0.99 * average_log_low_dual_steepest_edge_weight_error +
        0.01 * log(weight_error);
  } else {
    // Updated weight is correct or high
    weight_error = updated_edge_weight / computed_edge_weight;
    if (weight_error > kWeightErrorThreshold) {
      high_weight_error = 1;
      error_type = "High";
    }
    average_log_high_dual_steepest_edge_weight_error =
        0.99 * average_log_high_dual_steepest_edge_weight_error +
        0.01 * log(weight_error);
  }
  average_frequency_low_dual_steepest_edge_weight =
      0.99 * average_frequency_low_dual_steepest_edge_weight +
      0.01 * low_weight_error;
  average_frequency_high_dual_steepest_edge_weight =
      0.99 * average_frequency_high_dual_steepest_edge_weight +
      0.01 * high_weight_error;
  max_average_frequency_low_dual_steepest_edge_weight =
      max(max_average_frequency_low_dual_steepest_edge_weight,
          average_frequency_low_dual_steepest_edge_weight);
  max_average_frequency_high_dual_steepest_edge_weight =
      max(max_average_frequency_high_dual_steepest_edge_weight,
          average_frequency_high_dual_steepest_edge_weight);
  max_sum_average_frequency_extreme_dual_steepest_edge_weight =
      max(max_sum_average_frequency_extreme_dual_steepest_edge_weight,
          average_frequency_low_dual_steepest_edge_weight +
              average_frequency_high_dual_steepest_edge_weight);
  max_average_log_low_dual_steepest_edge_weight_error =
      max(max_average_log_low_dual_steepest_edge_weight_error,
          average_log_low_dual_steepest_edge_weight_error);
  max_average_log_high_dual_steepest_edge_weight_error =
      max(max_average_log_high_dual_steepest_edge_weight_error,
          average_log_high_dual_steepest_edge_weight_error);
  max_sum_average_log_extreme_dual_steepest_edge_weight_error =
      max(max_sum_average_log_extreme_dual_steepest_edge_weight_error,
          average_log_low_dual_steepest_edge_weight_error +
              average_log_high_dual_steepest_edge_weight_error);
  if (analyse_simplex_runtime_data) {
    const bool report_weight_error = false;
    if (report_weight_error && weight_error > 0.5 * kWeightErrorThreshold) {
      printf(
          "DSE Wt Ck |%8" HIGHSINT_FORMAT "| OK = %1d (%4" HIGHSINT_FORMAT
          " / %6" HIGHSINT_FORMAT
          ") (c %10.4g, u %10.4g, er %10.4g "
          "- "
          "%s): Low (Fq %10.4g, Er %10.4g); High (Fq%10.4g, Er%10.4g) | %10.4g "
          "%10.4g %10.4g %10.4g %10.4g %10.4g\n",
          simplex_iteration_count, accept_weight,
          num_dual_steepest_edge_weight_check,
          num_dual_steepest_edge_weight_reject, computed_edge_weight,
          updated_edge_weight, weight_error, error_type.c_str(),
          average_frequency_low_dual_steepest_edge_weight,
          average_log_low_dual_steepest_edge_weight_error,
          average_frequency_high_dual_steepest_edge_weight,
          average_log_high_dual_steepest_edge_weight_error,
          max_average_frequency_low_dual_steepest_edge_weight,
          max_average_frequency_high_dual_steepest_edge_weight,
          max_sum_average_frequency_extreme_dual_steepest_edge_weight,
          max_average_log_low_dual_steepest_edge_weight_error,
          max_average_log_high_dual_steepest_edge_weight_error,
          max_sum_average_log_extreme_dual_steepest_edge_weight_error);
    }
  }
}